

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

int INT_CMcontact_self_check(CManager_conflict cm,attr_list attrs)

{
  int iVar1;
  attr_list in_RSI;
  CManager_conflict in_RDI;
  bool bVar2;
  int result;
  transport_entry_conflict *trans_list;
  transport_entry_conflict *local_20;
  
  if (in_RDI->initialized == 0) {
    CMinitialize(in_RDI);
  }
  local_20 = in_RDI->transports;
  while( true ) {
    bVar2 = false;
    if (local_20 != (transport_entry_conflict *)0x0) {
      bVar2 = *local_20 != (transport_entry_conflict)0x0;
    }
    if (!bVar2) break;
    iVar1 = (*(*local_20)->self_check)(in_RDI,&CMstatic_trans_svcs,*local_20,in_RSI);
    if (iVar1 != 0) {
      return iVar1;
    }
    local_20 = local_20 + 1;
  }
  return 0;
}

Assistant:

int
 INT_CMcontact_self_check(CManager cm, attr_list attrs)
 {
     transport_entry *trans_list;
     if (!cm->initialized) CMinitialize(cm);
     trans_list = cm->transports;
     while ((trans_list != NULL) && (*trans_list != NULL)) {
	 int result = 0;
	 result = (*trans_list)->self_check(cm, &CMstatic_trans_svcs, 
					    *trans_list, attrs);
	 if (result) return result;
	 trans_list++;
     }
     return 0;
 }